

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O1

string * __thiscall
absl::StrCat<absl::Hex,char[4],std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d
          ,AlphaNum *e,Hex *args,char (*args_1) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Hex hex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  long *local_c8;
  undefined8 uStack_c0;
  long local_b8 [2];
  undefined8 local_a8;
  undefined8 uStack_a0;
  size_t local_98;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_80;
  size_t local_78;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_60;
  undefined8 local_58;
  long *local_50;
  size_t local_48;
  Hex *local_40;
  size_type local_38;
  undefined8 local_30;
  
  local_a8 = *(undefined8 *)this;
  uStack_a0 = *(undefined8 *)(this + 8);
  local_98 = (a->piece_)._M_len;
  pcStack_90 = (a->piece_)._M_str;
  local_88 = (b->piece_)._M_len;
  pcStack_80 = (b->piece_)._M_str;
  local_78 = (c->piece_)._M_len;
  pcStack_70 = (c->piece_)._M_str;
  local_68 = (d->piece_)._M_len;
  pcStack_60 = (d->piece_)._M_str;
  local_b8[1] = 0;
  uStack_c0 = 0;
  local_b8[0] = 0;
  hex._8_8_ = b;
  hex.value = (uint64_t)(e->piece_)._M_str;
  local_c8 = local_b8;
  AbslStringify<absl::strings_internal::StringifySink>
            ((absl *)&local_c8,(StringifySink *)(e->piece_)._M_len,hex);
  local_58 = uStack_c0;
  local_50 = local_c8;
  local_48 = strlen((char *)args);
  local_40 = args;
  local_30 = *(undefined8 *)args_1;
  local_38 = *(size_type *)(args_1 + 2);
  pieces._M_len = local_38;
  pieces._M_array = (iterator)0x8;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_a8,pieces);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}